

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       set_caster<std::unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>,kratos::Var*>
       ::
       cast<std::unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>>
                 (unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  forwarded_type<std::unordered_set<kratos::Var_*>,_kratos::Var_*const_&> ppVVar2;
  handle h;
  handle local_58;
  object value_;
  Var **value;
  iterator __end0;
  iterator __begin0;
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  *__range3;
  set s;
  return_value_policy policy_local;
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  *src_local;
  handle parent_local;
  
  s.super_object.super_handle.m_ptr._7_1_ = policy;
  s.super_object.super_handle.m_ptr._7_1_ =
       return_value_policy_override<kratos::Var_*,_void>::policy(policy);
  pybind11::set::set((set *)&__range3);
  __end0 = std::
           unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
           ::begin(src);
  value = (Var **)std::
                  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                  ::end(src);
  while (bVar1 = std::__detail::operator!=
                           (&__end0.super__Node_iterator_base<kratos::Var_*,_false>,
                            (_Node_iterator_base<kratos::Var_*,_false> *)&value), bVar1) {
    value_.super_handle.m_ptr =
         (handle)std::__detail::_Node_iterator<kratos::Var_*,_true,_false>::operator*(&__end0);
    ppVVar2 = forward_like<std::unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>,kratos::Var*const&>
                        ((Var **)value_.super_handle.m_ptr);
    h = type_caster_base<kratos::Var>::cast(*ppVVar2,s.super_object.super_handle.m_ptr._7_1_,parent)
    ;
    reinterpret_steal<pybind11::object>((pybind11 *)&local_58,h);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_58);
    if ((bVar1) &&
       (bVar1 = pybind11::set::add<pybind11::object&>((set *)&__range3,(object *)&local_58), bVar1))
    {
      bVar1 = false;
    }
    else {
      memset(&parent_local,0,8);
      pybind11::handle::handle(&parent_local);
      bVar1 = true;
    }
    object::~object((object *)&local_58);
    if (bVar1) goto LAB_00723c25;
    std::__detail::_Node_iterator<kratos::Var_*,_true,_false>::operator++(&__end0);
  }
  parent_local = object::release((object *)&__range3);
LAB_00723c25:
  pybind11::set::~set((set *)&__range3);
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }